

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solve_algorithms.cpp
# Opt level: O2

void __thiscall Clasp::SequentialSolve::SequentialSolve(SequentialSolve *this,SolveLimits *limit)

{
  uint64 uVar1;
  
  (this->super_SolveAlgorithm)._vptr_SolveAlgorithm = (_func_int **)&PTR__SolveAlgorithm_001e9958;
  uVar1 = limit->restarts;
  (this->super_SolveAlgorithm).limits_.conflicts = limit->conflicts;
  (this->super_SolveAlgorithm).limits_.restarts = uVar1;
  (this->super_SolveAlgorithm).ctx_ = (SharedContext *)0x0;
  (this->super_SolveAlgorithm).enum_.ptr_ = 1;
  (this->super_SolveAlgorithm).core_.ptr_ = 0;
  (this->super_SolveAlgorithm).onModel_ = (ModelHandler *)0x0;
  (this->super_SolveAlgorithm).path_.ptr_ = 0;
  (this->super_SolveAlgorithm).enumLimit_ = 0xffffffffffffffff;
  (this->super_SolveAlgorithm).optLimit_.ebo_.buf = (pointer)0x0;
  (this->super_SolveAlgorithm).optLimit_.ebo_.size = 0;
  (this->super_SolveAlgorithm).optLimit_.ebo_.cap = 0;
  *(undefined8 *)&(this->super_SolveAlgorithm).optLimit_.ebo_.cap = 0;
  *(undefined8 *)((long)&(this->super_SolveAlgorithm).time_ + 4) = 0;
  (this->super_SolveAlgorithm).reportM_ = true;
  (this->super_SolveAlgorithm)._vptr_SolveAlgorithm = (_func_int **)&PTR__SequentialSolve_001e99c0;
  (this->solve_).ptr_ = 1;
  this->term_ = -1;
  return;
}

Assistant:

SolveAlgorithm::SolveAlgorithm(const SolveLimits& lim)
	: limits_(lim), ctx_(0), enum_(0), onModel_(0), enumLimit_(UINT64_MAX), time_(0.0), last_(0), reportM_(true)  {
}